

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  clock_t cVar2;
  clock_t cVar3;
  Trie trie;
  Trie local_58;
  
  if (argc < 3) {
    poVar1 = std::operator<<((ostream *)&std::cout,"usage ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," dictfilePath textfilePath");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    Trie::Trie(&local_58);
    cVar2 = clock();
    Trie::loadDict(&local_58,argv[1]);
    cVar3 = clock();
    std::operator<<((ostream *)&std::cout," success in loadDict in ");
    poVar1 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout," insert ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," words");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"begin build clue");
    std::endl<char,std::char_traits<char>>(poVar1);
    cVar2 = clock();
    Trie::buildClue(&local_58);
    cVar3 = clock();
    std::operator<<((ostream *)&std::cout," success in build clue in ");
    poVar1 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
    std::endl<char,std::char_traits<char>>(poVar1);
    cVar2 = clock();
    Trie::matchTextFile(&local_58,argv[2]);
    cVar3 = clock();
    std::operator<<((ostream *)&std::cout," success in matchFile in ");
    poVar1 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
    poVar1 = std::operator<<(poVar1," total Null nodes : ");
    std::endl<char,std::char_traits<char>>(poVar1);
    getchar();
    Trie::~Trie(&local_58);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	if (argc < 3) {
	    cout << "usage " << argv[0] << " dictfilePath textfilePath" << endl;
	    return 0;
	}

	Trie trie;
	time_t time_s, time_e;
	time_s = clock();
	trie.loadDict(argv[1]);
	time_e = clock();
	cout << " success in loadDict in " << (double)(time_e - time_s)/CLOCKS_PER_SEC << endl;
	cout << " insert " << trie.getSize() << " words" << endl;

	cout << "begin build clue" << endl;
	time_s = clock();
	trie.buildClue();
	time_e = clock();
	cout << " success in build clue in " << (double)(time_e - time_s)/CLOCKS_PER_SEC << endl;

	int total = 0;

	time_s = clock();
    trie.matchTextFile(argv[2]);
    time_e = clock();
    cout << " success in matchFile in " << (double)(time_e - time_s)/CLOCKS_PER_SEC <<  " total Null nodes : " << endl;

    getchar();
	return 0;
}